

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O3

int ar_parse_gnu_filename_table(archive_read *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pvVar1 = a->format->data;
  pcVar6 = *(char **)((long)pvVar1 + 0x20);
  lVar2 = *(long *)((long)pvVar1 + 0x28);
  pcVar5 = pcVar6 + lVar2 + -1;
  pcVar4 = pcVar6;
  if (pcVar6 < pcVar5) {
    do {
      if (*pcVar6 == '/') {
        *pcVar6 = '\0';
        if (pcVar6[1] != '\n') goto LAB_0049a37d;
        pcVar6 = pcVar6 + 1;
        *pcVar6 = '\0';
        pcVar4 = *(char **)((long)pvVar1 + 0x20);
      }
      pcVar6 = pcVar6 + 1;
      pcVar5 = pcVar4 + lVar2 + -1;
    } while (pcVar6 < pcVar5);
  }
  if (((pcVar6 == pcVar4 + lVar2) || (*pcVar6 == '`')) || (*pcVar6 == '\n')) {
    *pcVar5 = '\0';
    iVar3 = 0;
  }
  else {
LAB_0049a37d:
    archive_set_error(&a->archive,0x16,"Invalid string table");
    free(*(void **)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    iVar3 = -0x1e;
  }
  return iVar3;
}

Assistant:

static int
ar_parse_gnu_filename_table(struct archive_read *a)
{
	struct ar *ar;
	char *p;
	size_t size;

	ar = (struct ar*)(a->format->data);
	size = ar->strtab_size;

	for (p = ar->strtab; p < ar->strtab + size - 1; ++p) {
		if (*p == '/') {
			*p++ = '\0';
			if (*p != '\n')
				goto bad_string_table;
			*p = '\0';
		}
	}
	/*
	 * GNU ar always pads the table to an even size.
	 * The pad character is either '\n' or '`'.
	 */
	if (p != ar->strtab + size && *p != '\n' && *p != '`')
		goto bad_string_table;

	/* Enforce zero termination. */
	ar->strtab[size - 1] = '\0';

	return (ARCHIVE_OK);

bad_string_table:
	archive_set_error(&a->archive, EINVAL,
	    "Invalid string table");
	free(ar->strtab);
	ar->strtab = NULL;
	return (ARCHIVE_FATAL);
}